

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

void prsclin(prscxdef *ctx,uint curfr,lindef *lin,int tellsrc,uchar *saved_loc)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  long lVar4;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  void *in_R8;
  uchar cur [20];
  int diff;
  uint in_stack_ffffffffffffffb8;
  ushort in_stack_ffffffffffffffbe;
  tokcxdef *in_stack_ffffffffffffffc0;
  int local_2c;
  
  local_2c = 0;
  if (in_ECX != 0) {
    dbgclin(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8);
  }
  emtres((emtcxdef *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  lVar4 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
  uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
  *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
  *(undefined1 *)(lVar4 + (int)(uint)uVar1) = 0x4e;
  emtres((emtcxdef *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  uVar2 = *(undefined2 *)(in_RDX + 0xcc);
  lVar4 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
  uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
  *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
  *(char *)(lVar4 + (int)(uint)uVar1) = (char)uVar2 + '\x04';
  emtres((emtcxdef *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),in_ESI);
  *(short *)(*(long *)(in_RDI + 0x28) + 0x12) = *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + 2;
  emtres((emtcxdef *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  uVar3 = *(undefined4 *)(in_RDX + 0xb8);
  lVar4 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
  uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
  *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
  *(char *)(lVar4 + (int)(uint)uVar1) = (char)uVar3;
  emtres((emtcxdef *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  if (in_R8 == (void *)0x0) {
    (**(code **)(in_RDX + 0x18))
              (in_RDX,*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                      (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12));
  }
  else {
    memcpy((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                   (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),in_R8,
           (ulong)*(ushort *)(in_RDX + 0xcc));
    (**(code **)(in_RDX + 0x18))(in_RDX,&stack0xffffffffffffffb8);
    local_2c = memcmp(&stack0xffffffffffffffb8,in_R8,(ulong)*(ushort *)(in_RDX + 0xcc));
  }
  *(short *)(*(long *)(in_RDI + 0x28) + 0x12) =
       *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + *(short *)(in_RDX + 0xcc);
  if (local_2c == 0) {
    lVar4 = *(long *)(*(long *)(in_RDI + 8) + 0x18);
    *(ushort *)(lVar4 + 200) = *(ushort *)(lVar4 + 200) | 4;
  }
  return;
}

Assistant:

static void prsclin(prscxdef *ctx, uint curfr, lindef *lin, int tellsrc,
                    const uchar *saved_loc)
{
    int diff = FALSE;

    /* tell the line source the location of the line */
    if (tellsrc)
    {
        dbgclin(ctx->prscxtok, ctx->prscxemt->emtcxobj,
                (uint)ctx->prscxemt->emtcxofs);
    }
        
    /* emit a LINE instruction, noting location and frame */
    emtop(ctx->prscxemt, OPCLINE);
    emtbyte(ctx->prscxemt, lin->linlln + 4);       /* note length of record */
    emtint2(ctx->prscxemt, curfr);           /* store current frame pointer */
    emtbyte(ctx->prscxemt, lin->linid);              /* save line source ID */
    emtres(ctx->prscxemt, lin->linlln);        /* make room for source part */

    /* use the saved location, or the current location if there isn't one */
    if (saved_loc != 0)
    {
        uchar cur[LINLLNMAX];
        
        /* use the saved location */
        memcpy(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs,
               saved_loc, lin->linlln);

        /* check to see if it's different from the current location */
        linglop(lin, cur);
        diff = memcmp(cur, saved_loc, lin->linlln);
    }
    else
    {
        /* no saved location - use the current location from the lindef */
        linglop(lin, ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs);
    }

    /* advance the output pointer */
    ctx->prscxemt->emtcxofs += lin->linlln;

    /* 
     *   indicate in line source that we've generated a debug record, as long
     *   as the generated location isn't different from current location (if
     *   it is, don't mark this line as used yet) 
     */
    if (!diff)
        ctx->prscxtok->tokcxlin->linflg |= LINFDBG;
}